

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

size_t unicode_to_utf8(char *p,size_t remaining,uint32_t uc)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  
  uVar3 = 0xfffd;
  if (uc < 0x110000) {
    uVar3 = uc;
  }
  bVar2 = (byte)uVar3;
  if (uVar3 < 0x80) {
    if (remaining == 0) {
      return 0;
    }
    pcVar1 = p + 1;
    *p = bVar2;
  }
  else if (uVar3 < 0x800) {
    if (remaining < 2) {
      return 0;
    }
    *p = (byte)(uVar3 >> 6) | 0xc0;
    pcVar1 = p + 2;
    p[1] = bVar2 & 0x3f | 0x80;
  }
  else if (uVar3 < 0x10000) {
    if (remaining < 3) {
      return 0;
    }
    *p = (byte)(uVar3 >> 0xc) | 0xe0;
    p[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
    pcVar1 = p + 3;
    p[2] = bVar2 & 0x3f | 0x80;
  }
  else {
    if (remaining < 4) {
      return 0;
    }
    *p = (byte)(uVar3 >> 0x12) | 0xf0;
    p[1] = (byte)(uVar3 >> 0xc) & 0x3f | 0x80;
    p[2] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
    pcVar1 = p + 4;
    p[3] = bVar2 & 0x3f | 0x80;
  }
  return (long)pcVar1 - (long)p;
}

Assistant:

static size_t
unicode_to_utf8(char *p, size_t remaining, uint32_t uc)
{
	char *_p = p;

	/* Invalid Unicode char maps to Replacement character */
	if (uc > UNICODE_MAX)
		uc = UNICODE_R_CHAR;
	/* Translate code point to UTF8 */
	if (uc <= 0x7f) {
		if (remaining == 0)
			return (0);
		*p++ = (char)uc;
	} else if (uc <= 0x7ff) {
		if (remaining < 2)
			return (0);
		*p++ = 0xc0 | ((uc >> 6) & 0x1f);
		*p++ = 0x80 | (uc & 0x3f);
	} else if (uc <= 0xffff) {
		if (remaining < 3)
			return (0);
		*p++ = 0xe0 | ((uc >> 12) & 0x0f);
		*p++ = 0x80 | ((uc >> 6) & 0x3f);
		*p++ = 0x80 | (uc & 0x3f);
	} else {
		if (remaining < 4)
			return (0);
		*p++ = 0xf0 | ((uc >> 18) & 0x07);
		*p++ = 0x80 | ((uc >> 12) & 0x3f);
		*p++ = 0x80 | ((uc >> 6) & 0x3f);
		*p++ = 0x80 | (uc & 0x3f);
	}
	return (p - _p);
}